

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void housemat(double *v,int N,double beta,double *mat)

{
  double *C;
  ulong uVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  double dVar5;
  
  C = (double *)malloc((long)N * (long)N * 8);
  if (0 < N) {
    uVar1 = (ulong)(uint)N;
    uVar2 = 0;
    pdVar3 = mat;
    do {
      uVar4 = 0;
      do {
        dVar5 = 1.0;
        if (uVar2 != uVar4) {
          dVar5 = 0.0;
        }
        pdVar3[uVar4] = dVar5;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      uVar2 = uVar2 + 1;
      pdVar3 = pdVar3 + uVar1;
    } while (uVar2 != uVar1);
  }
  mmult(v,v,C,N,1,N);
  if (N != 0) {
    uVar1 = 0;
    do {
      C[uVar1] = C[uVar1] * beta;
      uVar1 = uVar1 + 1;
    } while ((uint)(N * N) != uVar1);
    if (N != 0) {
      uVar1 = 0;
      do {
        mat[uVar1] = mat[uVar1] - C[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)(N * N) != uVar1);
    }
  }
  free(C);
  return;
}

Assistant:

void housemat(double *v, int N,double beta,double *mat) {
	double *temp;
	
	temp = (double*) malloc(sizeof(double) * N * N);
	eye(mat,N);
	mmult(v,v,temp,N,1,N);
	scale(temp,N,N,beta);
	msub(mat,temp,mat,N,N);
	
	free(temp);
}